

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_py_function_helpers(t_py_generator *this,t_function *tfunction)

{
  t_program *program;
  bool bVar1;
  uint uVar2;
  string *__lhs;
  t_type *ptVar3;
  t_struct *this_00;
  reference pptVar4;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_210
  ;
  t_field **local_208;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_200
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *xs;
  string local_1e0;
  undefined1 local_1c0 [8];
  t_field success;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  t_struct result;
  t_function *tfunction_local;
  t_py_generator *this_local;
  
  result._192_8_ = tfunction;
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    program = (this->super_t_generator).program_;
    __lhs = t_function::get_name_abi_cxx11_((t_function *)result._192_8_);
    std::operator+(&local_100,__lhs,"_result");
    t_struct::t_struct((t_struct *)local_e0,program,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    ptVar3 = t_function::get_returntype((t_function *)result._192_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"success",(allocator *)((long)&xs + 7));
    t_field::t_field((t_field *)local_1c0,ptVar3,&local_1e0,0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
    ptVar3 = t_function::get_returntype((t_function *)result._192_8_);
    uVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      t_struct::append((t_struct *)local_e0,(t_field *)local_1c0);
    }
    this_00 = t_function::get_xceptions((t_function *)result._192_8_);
    f_iter._M_current = (t_field **)t_struct::get_members(this_00);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_200);
    local_208 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_200._M_current = local_208;
    while( true ) {
      local_210._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_200,&local_210);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_200);
      t_struct::append((t_struct *)local_e0,*pptVar4);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_200);
    }
    generate_py_struct_definition(this,(ostream *)&this->f_service_,(t_struct *)local_e0,false);
    generate_py_thrift_spec(this,(ostream *)&this->f_service_,(t_struct *)local_e0,false);
    t_field::~t_field((t_field *)local_1c0);
    t_struct::~t_struct((t_struct *)local_e0);
  }
  return;
}

Assistant:

void t_py_generator::generate_py_function_helpers(t_function* tfunction) {
  if (!tfunction->is_oneway()) {
    t_struct result(program_, tfunction->get_name() + "_result");
    t_field success(tfunction->get_returntype(), "success", 0);
    if (!tfunction->get_returntype()->is_void()) {
      result.append(&success);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& fields = xs->get_members();
    vector<t_field*>::const_iterator f_iter;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      result.append(*f_iter);
    }
    generate_py_struct_definition(f_service_, &result, false);
    generate_py_thrift_spec(f_service_, &result, false);
  }
}